

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>::move<kj::StringPtr,kj::StringPtr>
          (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *this,ArrayPtr<kj::StringPtr> table
          ,size_t oldPos,size_t newPos,StringPtr *params)

{
  HashBucket *pHVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  StringPtr str;
  ulong uVar5;
  
  str.content.size_ = table.size_;
  str.content.ptr = *(char **)(oldPos + 8);
  uVar3 = _::anon_unknown_0::StringHasher::hashCode(*(StringHasher **)oldPos,str);
  pHVar1 = (this->buckets).ptr;
  sVar2 = (this->buckets).size_;
  uVar4 = (int)sVar2 - 1U & uVar3;
  while( true ) {
    uVar5 = (ulong)uVar4;
    uVar3 = pHVar1[uVar5].value;
    if ((int)table.ptr + 2U == uVar3) {
      pHVar1[uVar5].value = (int)table.size_ + 2;
      return;
    }
    if (uVar3 == 0) break;
    uVar4 = (uint)(uVar5 + 1);
    if (uVar5 + 1 == sVar2) {
      uVar4 = 0;
    }
  }
  _::logHashTableInconsistency();
  return;
}

Assistant:

void move(kj::ArrayPtr<Row> table, size_t oldPos, size_t newPos, Params&&... params) {
    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isPos(oldPos)) {
        // found it
        bucket.setPos(newPos);
        return;
      } else if (bucket.isEmpty()) {
        // can't find the bucket, something is very wrong
        _::logHashTableInconsistency();
        return;
      }
    }
  }